

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

bool libtorrent::aux::anon_unknown_135::connecting_time_compare
               (peer_connection *lhs,peer_connection *rhs)

{
  bool bVar1;
  int iVar2;
  byte local_3a;
  byte local_39;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_38;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_30;
  byte local_22;
  byte local_21;
  bool rhs_connecting;
  peer_connection *ppStack_20;
  bool lhs_connecting;
  peer_connection *rhs_local;
  peer_connection *lhs_local;
  
  ppStack_20 = rhs;
  rhs_local = lhs;
  bVar1 = peer_connection::is_connecting(lhs);
  local_39 = 0;
  if (bVar1) {
    iVar2 = (*(rhs_local->super_bandwidth_socket)._vptr_bandwidth_socket[1])();
    local_39 = (byte)iVar2 ^ 0xff;
  }
  local_21 = local_39 & 1;
  bVar1 = peer_connection::is_connecting(ppStack_20);
  local_3a = 0;
  if (bVar1) {
    iVar2 = (*(ppStack_20->super_bandwidth_socket)._vptr_bandwidth_socket[1])();
    local_3a = (byte)iVar2 ^ 0xff;
  }
  local_22 = local_3a & 1;
  if ((local_21 & 1) == local_22) {
    local_30.__d.__r = (duration)peer_connection::connected_time(rhs_local);
    local_38.__d.__r = (duration)peer_connection::connected_time(ppStack_20);
    lhs_local._7_1_ = ::std::chrono::operator>(&local_30,&local_38);
  }
  else {
    lhs_local._7_1_ = (local_21 & 1) < local_22;
  }
  return lhs_local._7_1_;
}

Assistant:

bool connecting_time_compare(peer_connection const* lhs, peer_connection const* rhs)
	{
		bool const lhs_connecting = lhs->is_connecting() && !lhs->is_disconnecting();
		bool const rhs_connecting = rhs->is_connecting() && !rhs->is_disconnecting();
		if (lhs_connecting != rhs_connecting) return (int(lhs_connecting) < int(rhs_connecting));

		// a lower value of connected_time means it's been waiting
		// longer. This is a less-than comparison, so if lhs has
		// waited longer than rhs, we should return false.
		return lhs->connected_time() > rhs->connected_time();
	}